

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# armutils.h
# Opt level: O0

bool asmjit::v1_14::arm::Utils::encodeLogicalImm(uint64_t imm,uint32_t width,LogicalImm *out)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  uint *in_RDX;
  uint in_ESI;
  ulong in_RDI;
  ulong local_1b0;
  uint local_19c;
  ulong local_198;
  uint local_184;
  ulong local_180;
  uint local_124;
  bool local_111;
  uint64_t mustBeZero;
  uint32_t oCount;
  uint64_t oImm;
  uint32_t oIndex;
  uint32_t zCount;
  uint64_t zImm;
  uint32_t zIndex;
  uint64_t lsbMask;
  uint64_t mask;
  
  local_124 = in_ESI;
  do {
    local_124 = local_124 >> 1;
    uVar3 = (1L << ((byte)local_124 & 0x3f)) - 1;
    if ((in_RDI & uVar3) != (in_RDI >> ((byte)local_124 & 0x3f) & uVar3)) {
      local_124 = local_124 << 1;
      break;
    }
  } while (2 < local_124);
  if (local_124 == 0) {
    local_180 = 0;
  }
  else {
    local_180 = 0xffffffffffffffff >> (0x40U - (char)local_124 & 0x3f);
  }
  uVar3 = local_180 & in_RDI;
  if ((uVar3 == 0) || (uVar3 == local_180)) {
    local_111 = false;
  }
  else {
    iVar1 = 0;
    for (uVar4 = uVar3 ^ 0xffffffffffffffff; (uVar4 & 1) == 0;
        uVar4 = uVar4 >> 1 | 0x8000000000000000) {
      iVar1 = iVar1 + 1;
    }
    uVar3 = uVar3 ^ (1L << ((byte)iVar1 & 0x3f)) - 1U;
    if (uVar3 == 0) {
      local_184 = local_124;
    }
    else {
      local_184 = 0;
      for (uVar4 = uVar3; (uVar4 & 1) == 0; uVar4 = uVar4 >> 1 | 0x8000000000000000) {
        local_184 = local_184 + 1;
      }
    }
    if (local_184 == 0) {
      local_198 = 0;
    }
    else {
      local_198 = 0xffffffffffffffff >> (0x40U - (char)local_184 & 0x3f);
    }
    uVar3 = uVar3 ^ local_198 ^ 0xffffffffffffffff;
    if (uVar3 == 0) {
      local_19c = local_124;
    }
    else {
      local_19c = 0;
      for (uVar4 = uVar3; (uVar4 & 1) == 0; uVar4 = uVar4 >> 1 | 0x8000000000000000) {
        local_19c = local_19c + 1;
      }
    }
    iVar2 = local_19c - local_184;
    if (local_184 + iVar2 == 0) {
      local_1b0 = 0;
    }
    else {
      local_1b0 = 0xffffffffffffffff >> (0x40U - (char)(local_184 + iVar2) & 0x3f);
    }
    if ((uVar3 == (local_1b0 ^ 0xffffffffffffffff)) &&
       ((iVar1 == 0 || (local_124 == local_184 + iVar2)))) {
      *in_RDX = (uint)(local_124 == 0x40);
      in_RDX[1] = (iVar2 + iVar1) - 1U | local_124 * -2 & 0x3f;
      in_RDX[2] = local_124 - local_184;
      local_111 = true;
    }
    else {
      local_111 = false;
    }
  }
  return local_111;
}

Assistant:

ASMJIT_MAYBE_UNUSED
static bool encodeLogicalImm(uint64_t imm, uint32_t width, LogicalImm* out) noexcept {
  // Determine the element width, which must be 2, 4, 8, 16, 32, or 64 bits.
  do {
    width /= 2;
    uint64_t mask = (uint64_t(1) << width) - 1u;
    if ((imm & mask) != ((imm >> width) & mask)) {
      width *= 2;
      break;
    }
  } while (width > 2);

  // Patterns of all zeros and all ones are not encodable.
  uint64_t lsbMask = Support::lsbMask<uint64_t>(width);
  imm &= lsbMask;

  if (imm == 0 || imm == lsbMask)
    return false;

  // Inspect the pattern and get the most important bit indexes.
  //
  //         oIndex <-+      +-> zIndex
  //                  |      |
  // |..zeros..|oCount|zCount|..ones..|
  // |000000000|111111|000000|11111111|

  uint32_t zIndex = Support::ctz(~imm);
  uint64_t zImm = imm ^ ((uint64_t(1) << zIndex) - 1);
  uint32_t zCount = (zImm ? Support::ctz(zImm) : width) - zIndex;

  uint32_t oIndex = zIndex + zCount;
  uint64_t oImm = ~(zImm ^ Support::lsbMask<uint64_t>(oIndex));
  uint32_t oCount = (oImm ? Support::ctz(oImm) : width) - (oIndex);

  // Verify whether the bit-pattern is encodable.
  uint64_t mustBeZero = oImm ^ ~Support::lsbMask<uint64_t>(oIndex + oCount);
  if (mustBeZero != 0 || (zIndex > 0 && width - (oIndex + oCount) != 0))
    return false;

  out->n = width == 64;
  out->s = (oCount + zIndex - 1) | (Support::neg(width * 2) & 0x3F);
  out->r = width - oIndex;
  return true;
}